

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_ori_16_di(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint value;
  uint res;
  uint ea;
  uint src;
  
  uVar1 = m68ki_read_imm_16();
  uVar3 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar2 = m68ki_read_imm_16();
  uVar3 = uVar3 + (int)(short)uVar2;
  uVar2 = m68ki_read_16_fc(uVar3,m68ki_cpu.s_flag | m68ki_address_space);
  value = (uVar1 | uVar2) & 0xffff;
  m68ki_write_16_fc(uVar3,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value >> 8;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.c_flag = 0;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_ori_16_di(void)
{
	uint src = OPER_I_16();
	uint ea = EA_AY_DI_16();
	uint res = MASK_OUT_ABOVE_16(src | m68ki_read_16(ea));

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}